

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O3

ZCC_ExprConstant * __thiscall
ZCCCompiler::NodeFromSymbolConst(ZCCCompiler *this,PSymbolConst *sym,ZCC_Expression *idnode)

{
  PType *pPVar1;
  int iVar2;
  ZCC_ExprConstant *pZVar3;
  undefined4 extraout_var;
  FString *pFVar5;
  undefined4 extraout_var_00;
  PClass *pPVar6;
  undefined4 extraout_var_02;
  PClass *pPVar7;
  bool bVar8;
  PClass *pPVar4;
  undefined4 extraout_var_01;
  
  pZVar3 = (ZCC_ExprConstant *)
           ZCC_AST::InitNode(this->AST,0x38,AST_ExprConstant,&idnode->super_ZCC_TreeNode);
  (pZVar3->super_ZCC_Expression).Operation = PEX_ConstValue;
  pPVar6 = PSymbolConstString::RegistrationInfo.MyClass;
  if (sym == (PSymbolConst *)0x0) {
    (pZVar3->super_ZCC_Expression).Type = &TypeError->super_PType;
    (pZVar3->field_0).IntVal = 0;
  }
  else {
    pPVar4 = (sym->super_PSymbol).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(sym->super_PSymbol).super_DObject._vptr_DObject)(sym);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
      (sym->super_PSymbol).super_DObject.Class = pPVar4;
    }
    bVar8 = pPVar4 != (PClass *)0x0;
    pPVar7 = pPVar4;
    if (pPVar4 != pPVar6 && bVar8) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar8 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar6) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (bVar8) {
      pFVar5 = FSharedStringArena::Alloc(&this->AST->Strings,(FString *)(sym + 1));
      (pZVar3->field_0).StringVal = pFVar5;
      (pZVar3->super_ZCC_Expression).Type = (PType *)TypeString;
    }
    else {
      pPVar1 = sym->ValueType;
      (pZVar3->super_ZCC_Expression).Type = pPVar1;
      pPVar6 = PSymbolConstNumeric::RegistrationInfo.MyClass;
      if (pPVar1 != &TypeError->super_PType) {
        if (pPVar4 == (PClass *)0x0) {
          iVar2 = (**(sym->super_PSymbol).super_DObject._vptr_DObject)(sym);
          pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar2);
          (sym->super_PSymbol).super_DObject.Class = pPVar4;
        }
        pPVar7 = PInt::RegistrationInfo.MyClass;
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar6 && bVar8) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar8 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar6) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                        ,0x264,
                        "ZCC_ExprConstant *ZCCCompiler::NodeFromSymbolConst(PSymbolConst *, ZCC_Expression *)"
                       );
        }
        pPVar1 = sym->ValueType;
        pPVar6 = (pPVar1->super_DObject).Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar2 = (**(pPVar1->super_DObject)._vptr_DObject)(pPVar1);
          pPVar6 = (PClass *)CONCAT44(extraout_var_01,iVar2);
          (pPVar1->super_DObject).Class = pPVar6;
        }
        pPVar4 = PFloat::RegistrationInfo.MyClass;
        bVar8 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar7 && bVar8) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar8 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar7) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (bVar8) {
          (pZVar3->field_0).IntVal = *(int *)&sym[1].super_PSymbol.super_DObject._vptr_DObject;
        }
        else {
          pPVar1 = sym->ValueType;
          pPVar6 = (pPVar1->super_DObject).Class;
          if (pPVar6 == (PClass *)0x0) {
            iVar2 = (**(pPVar1->super_DObject)._vptr_DObject)(pPVar1);
            pPVar6 = (PClass *)CONCAT44(extraout_var_02,iVar2);
            (pPVar1->super_DObject).Class = pPVar6;
          }
          bVar8 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar4 && bVar8) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar8 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar4) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if (!bVar8) {
            __assert_fail("sym->ValueType->IsKindOf(RUNTIME_CLASS(PFloat))",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                          ,0x26b,
                          "ZCC_ExprConstant *ZCCCompiler::NodeFromSymbolConst(PSymbolConst *, ZCC_Expression *)"
                         );
          }
          pZVar3->field_0 = *(anon_union_8_4_c6e8ba38_for_ZCC_ExprConstant_1 *)(sym + 1);
        }
      }
    }
  }
  return pZVar3;
}

Assistant:

ZCC_ExprConstant *ZCCCompiler::NodeFromSymbolConst(PSymbolConst *sym, ZCC_Expression *idnode)
{
	ZCC_ExprConstant *val = static_cast<ZCC_ExprConstant *>(AST.InitNode(sizeof(*val), AST_ExprConstant, idnode));
	val->Operation = PEX_ConstValue;
	if (sym == NULL)
	{
		val->Type = TypeError;
		val->IntVal = 0;
	}
	else if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConstString)))
	{
		val->StringVal = AST.Strings.Alloc(static_cast<PSymbolConstString *>(sym)->Str);
		val->Type = TypeString;
	}
	else
	{
		val->Type = sym->ValueType;
		if (val->Type != TypeError)
		{
			assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric)));
			if (sym->ValueType->IsKindOf(RUNTIME_CLASS(PInt)))
			{
				val->IntVal = static_cast<PSymbolConstNumeric *>(sym)->Value;
			}
			else
			{
				assert(sym->ValueType->IsKindOf(RUNTIME_CLASS(PFloat)));
				val->DoubleVal = static_cast<PSymbolConstNumeric *>(sym)->Float;
			}
		}
	}
	return val;
}